

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O0

void __thiscall leveldb::EnvTest_RunImmediately_Test::TestBody(EnvTest_RunImmediately_Test *this)

{
  Env *pEVar1;
  MutexLock local_80;
  MutexLock l;
  RunState state;
  EnvTest_RunImmediately_Test *this_local;
  
  state._96_8_ = this;
  TestBody::RunState::RunState((RunState *)&l);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x11])(pEVar1,TestBody::RunState::Run,&l);
  MutexLock::MutexLock(&local_80,(Mutex *)&l);
  while ((((byte)state.cvar.mu_ ^ 0xff) & 1) != 0) {
    port::CondVar::Wait((CondVar *)&state.mu.mu_.super___mutex_base._M_mutex.__data.__list.__next);
  }
  MutexLock::~MutexLock(&local_80);
  TestBody::RunState::~RunState((RunState *)&l);
  return;
}

Assistant:

TEST_F(EnvTest, RunImmediately) {
  struct RunState {
    port::Mutex mu;
    port::CondVar cvar{&mu};
    bool called = false;

    static void Run(void* arg) {
      RunState* state = reinterpret_cast<RunState*>(arg);
      MutexLock l(&state->mu);
      ASSERT_EQ(state->called, false);
      state->called = true;
      state->cvar.Signal();
    }
  };

  RunState state;
  env_->Schedule(&RunState::Run, &state);

  MutexLock l(&state.mu);
  while (!state.called) {
    state.cvar.Wait();
  }
}